

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::FunctionalTest::prepareShaderPrograms
          (FunctionalTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 *puVar6;
  GLsizei log_size;
  GLint status;
  undefined1 local_11a8 [384];
  GLchar log [4096];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if ((this->m_spo_v == 0) && (this->m_spo_f == 0)) {
    GVar3 = (**(code **)(lVar5 + 0x3f8))(0x8b31,1,&s_vertex_shader);
    this->m_spo_v = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glCreateShaderProgramv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x27e);
    status = 1;
    (**(code **)(lVar5 + 0x9d8))(this->m_spo_v,0x8b83,&status);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetProgramiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x283);
    if (status == 0) {
      memset(log,0,0x1000);
      log_size = 0;
      (**(code **)(lVar5 + 0x988))(this->m_spo_v,0x1000,&log_size,log);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGetProgramInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                      ,0x28e);
      local_11a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_11a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Vertex shader program building failed with log: ");
      std::operator<<((ostream *)poVar1,log);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_11a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      GVar3 = (**(code **)(lVar5 + 0x3f8))(0x8b30,1,&s_fragment_shader);
      this->m_spo_f = GVar3;
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glCreateShaderProgramv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                      ,0x298);
      status = 1;
      (**(code **)(lVar5 + 0x9d8))(this->m_spo_f,0x8b83,&status);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGetProgramiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                      ,0x29d);
      if (status != 0) {
        return;
      }
      memset(log,0,0x1000);
      log_size = 0;
      (**(code **)(lVar5 + 0x988))(this->m_spo_f,0x1000,&log_size,log);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGetProgramInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                      ,0x2a8);
      local_11a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_11a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Fragment shader program building failed with log: ");
      std::operator<<((ostream *)poVar1,log);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_11a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_11a8);
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::prepareShaderPrograms()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Log size limit. */
	static const glw::GLsizei max_log_size = 4096;

	/* Sanity check. */
	if (m_spo_v || m_spo_f)
	{
		throw 0;
	}

	/* Create Vertex Shader Program. */
	m_spo_v = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, &s_vertex_shader);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv call failed.");

	glw::GLint status = GL_TRUE;

	gl.getProgramiv(m_spo_v, GL_VALIDATE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

	if (GL_FALSE == status)
	{
		/* Storage for data. */
		glw::GLchar log[max_log_size] = { 0 };

		/* Storage fetched length. */
		glw::GLsizei log_size = 0;

		gl.getProgramInfoLog(m_spo_v, max_log_size, &log_size, log);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Vertex shader program building failed with log: " << log
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	m_spo_f = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, &s_fragment_shader);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv call failed.");

	status = GL_TRUE;

	gl.getProgramiv(m_spo_f, GL_VALIDATE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

	if (GL_FALSE == status)
	{
		/* Storage for data. */
		glw::GLchar log[max_log_size] = { 0 };

		/* Storage fetched length. */
		glw::GLsizei log_size = 0;

		gl.getProgramInfoLog(m_spo_f, max_log_size, &log_size, log);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Fragment shader program building failed with log: " << log
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}